

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O0

void __thiscall BRTS_XZ<RemSP>::PerformLabelingWithSteps(BRTS_XZ<RemSP> *this)

{
  PerformanceEvaluator *pPVar1;
  double dVar2;
  string local_90 [32];
  double local_70;
  double t_runalloc;
  string local_38 [32];
  double local_18;
  double alloc_timing;
  BRTS_XZ<RemSP> *this_local;
  
  alloc_timing = (double)this;
  local_18 = Alloc(this);
  InitCompressedData(this,&this->data_compressed);
  pPVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(pPVar1);
  FirstScan(this);
  PerformanceEvaluator::stop(pPVar1);
  Step_abi_cxx11_((StepType)local_38);
  dVar2 = PerformanceEvaluator::last(pPVar1);
  PerformanceEvaluator::store(pPVar1,local_38,dVar2);
  std::__cxx11::string::~string((string *)local_38);
  pPVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(pPVar1);
  SecondScan(this);
  PerformanceEvaluator::stop(pPVar1);
  Step_abi_cxx11_((StepType)(string *)&t_runalloc);
  dVar2 = PerformanceEvaluator::last(pPVar1);
  PerformanceEvaluator::store(pPVar1,(string *)&t_runalloc,dVar2);
  std::__cxx11::string::~string((string *)&t_runalloc);
  local_70 = Get_RunAllocTime(this);
  pPVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(pPVar1);
  Dealloc(this);
  PerformanceEvaluator::stop(pPVar1);
  Step_abi_cxx11_((StepType)local_90);
  dVar2 = PerformanceEvaluator::last(pPVar1);
  PerformanceEvaluator::store(pPVar1,local_90,dVar2 + local_18 + local_70);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void PerformLabelingWithSteps() {
        double alloc_timing = Alloc();
        InitCompressedData(data_compressed);

        perf_.start();
        FirstScan();
        perf_.stop();
        perf_.store(Step(StepType::FIRST_SCAN), perf_.last());

        perf_.start();
        SecondScan();
        perf_.stop();
        perf_.store(Step(StepType::SECOND_SCAN), perf_.last());

        double t_runalloc = Get_RunAllocTime();
        perf_.start();
        Dealloc();
        perf_.stop();
        perf_.store(Step(StepType::ALLOC_DEALLOC), perf_.last() + alloc_timing + t_runalloc);
    }